

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

StkId tryfuncTM(lua_State *L,StkId func)

{
  TValue *pTVar1;
  TValue *io1;
  StkId pSVar2;
  TValue *io1_1;
  StkId local_20;
  
  if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
    tryfuncTM_cold_1();
    func = local_20;
  }
  pTVar1 = luaT_gettmbyobj(L,&func->val,TM_CALL);
  if ((pTVar1->tt_ & 0xf) != 0) {
    pSVar2 = (L->top).p;
    if (func < pSVar2) {
      do {
        (pSVar2->val).value_ = pSVar2[-1].val.value_;
        (pSVar2->val).tt_ = *(lu_byte *)((long)pSVar2 - 8);
        pSVar2 = pSVar2 + -1;
      } while (func < pSVar2);
      pSVar2 = (StkId)(L->top).offset;
    }
    (L->top).p = pSVar2 + 1;
    (func->val).value_ = pTVar1->value_;
    (func->val).tt_ = pTVar1->tt_;
    return func;
  }
  luaG_callerror(L,&func->val);
}

Assistant:

static StkId tryfuncTM (lua_State *L, StkId func) {
  const TValue *tm;
  StkId p;
  checkstackGCp(L, 1, func);  /* space for metamethod */
  tm = luaT_gettmbyobj(L, s2v(func), TM_CALL);  /* (after previous GC) */
  if (l_unlikely(ttisnil(tm)))
    luaG_callerror(L, s2v(func));  /* nothing to call */
  for (p = L->top.p; p > func; p--)  /* open space for metamethod */
    setobjs2s(L, p, p-1);
  L->top.p++;  /* stack space pre-allocated by the caller */
  setobj2s(L, func, tm);  /* metamethod is the new function to be called */
  return func;
}